

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmAddDefinition(void *arg,char *name,char *value)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  cmMakefile::AddDefinition((cmMakefile *)arg,&local_38,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CCONV cmAddDefinition(void *arg, const char* name, const char* value)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  mf->AddDefinition(name,value);
}